

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void duckdb::DefineReservoirQuantile(AggregateFunctionSet *set,LogicalType *type)

{
  long lVar1;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *this;
  undefined8 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  AggregateFunction fun;
  undefined1 local_750 [144];
  LogicalType aLStack_6c0 [32];
  undefined8 auStack_6a0 [14];
  element_type *local_630;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_628;
  undefined1 local_620 [176];
  undefined8 auStack_570 [14];
  element_type *local_500;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4f8;
  undefined1 local_4f0 [176];
  undefined8 local_440 [14];
  element_type *local_3d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3c8;
  undefined1 local_3c0 [176];
  undefined8 local_310 [14];
  element_type *local_2a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_298;
  undefined1 local_290 [176];
  undefined8 local_1e0 [14];
  element_type *local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  undefined **local_160 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  bVar4 = 0;
  GetReservoirQuantileAggregate((AggregateFunction *)local_750,(PhysicalType)type[1]);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_620,(SimpleFunction *)local_750);
  local_620._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_620 + 0x90),aLStack_6c0);
  local_620[0xa8] = aLStack_6c0[0x18];
  local_620[0xa9] = aLStack_6c0[0x19];
  local_620[0xaa] = aLStack_6c0[0x1a];
  local_620[0xab] = aLStack_6c0[0x1b];
  local_620._0_8_ = &PTR__AggregateFunction_00897e98;
  puVar2 = auStack_6a0;
  puVar3 = auStack_570;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  auStack_570[0xd]._0_1_ = (AggregateOrderDependent)auStack_6a0[0xd];
  auStack_570[0xd]._1_1_ = auStack_6a0[0xd]._1_1_;
  local_500 = local_630;
  local_4f8._M_pi = local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  this = (vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
         (set + 0x20);
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_620);
  local_620._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_4f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4f8._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_620);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_750 + 0x48),
             (LogicalTypeId *)&LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_290,(SimpleFunction *)local_750);
  local_290._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_290 + 0x90),aLStack_6c0);
  local_290[0xa8] = aLStack_6c0[0x18];
  local_290[0xa9] = aLStack_6c0[0x19];
  local_290[0xaa] = aLStack_6c0[0x1a];
  local_290[0xab] = aLStack_6c0[0x1b];
  local_290._0_8_ = &PTR__AggregateFunction_00897e98;
  puVar2 = auStack_6a0;
  puVar3 = local_1e0;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_1e0[0xd]._0_1_ = (AggregateOrderDependent)auStack_6a0[0xd];
  local_1e0[0xd]._1_1_ = auStack_6a0[0xd]._1_1_;
  local_170 = local_630;
  local_168._M_pi = local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_290);
  local_290._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_290);
  GetReservoirQuantileListAggregate((AggregateFunction *)local_160,type);
  AggregateFunction::operator=((AggregateFunction *)local_750,(AggregateFunction *)local_160);
  local_160[0] = &PTR__AggregateFunction_00897e98;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_3c0,(SimpleFunction *)local_750);
  local_3c0._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_3c0 + 0x90),aLStack_6c0);
  local_3c0[0xa8] = aLStack_6c0[0x18];
  local_3c0[0xa9] = aLStack_6c0[0x19];
  local_3c0[0xaa] = aLStack_6c0[0x1a];
  local_3c0[0xab] = aLStack_6c0[0x1b];
  local_3c0._0_8_ = &PTR__AggregateFunction_00897e98;
  puVar2 = auStack_6a0;
  puVar3 = local_310;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_310[0xd]._0_1_ = (AggregateOrderDependent)auStack_6a0[0xd];
  local_310[0xd]._1_1_ = auStack_6a0[0xd]._1_1_;
  local_2a0 = local_630;
  local_298._M_pi = local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_3c0);
  local_3c0._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_298._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_298._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_3c0);
  std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
  emplace_back<duckdb::LogicalTypeId_const&>
            ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)(local_750 + 0x48),
             (LogicalTypeId *)&LogicalType::INTEGER);
  SimpleFunction::SimpleFunction((SimpleFunction *)local_4f0,(SimpleFunction *)local_750);
  local_4f0._0_8_ = duckdb::Value::DECIMAL;
  duckdb::LogicalType::LogicalType((LogicalType *)(local_4f0 + 0x90),aLStack_6c0);
  local_4f0[0xa8] = aLStack_6c0[0x18];
  local_4f0[0xa9] = aLStack_6c0[0x19];
  local_4f0[0xaa] = aLStack_6c0[0x1a];
  local_4f0[0xab] = aLStack_6c0[0x1b];
  local_4f0._0_8_ = &PTR__AggregateFunction_00897e98;
  puVar2 = auStack_6a0;
  puVar3 = local_440;
  for (lVar1 = 0xd; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  local_440[0xd]._0_1_ = (AggregateOrderDependent)auStack_6a0[0xd];
  local_440[0xd]._1_1_ = auStack_6a0[0xd]._1_1_;
  local_3d0 = local_630;
  local_3c8._M_pi = local_628._M_pi;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_628._M_pi)->_M_use_count = (local_628._M_pi)->_M_use_count + 1;
    }
  }
  std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
  emplace_back<duckdb::AggregateFunction>(this,(AggregateFunction *)local_4f0);
  local_4f0._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_3c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3c8._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_4f0);
  local_750._0_8_ = &PTR__AggregateFunction_00897e98;
  if (local_628._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_628._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_750);
  return;
}

Assistant:

static void DefineReservoirQuantile(AggregateFunctionSet &set, const LogicalType &type) {
	//	Four versions: type, scalar/list[, count]
	auto fun = GetReservoirQuantileAggregate(type.InternalType());
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);

	// List variants
	fun = GetReservoirQuantileListAggregate(type);
	set.AddFunction(fun);

	fun.arguments.emplace_back(LogicalType::INTEGER);
	set.AddFunction(fun);
}